

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PerseusBGPlanner.cpp
# Opt level: O0

void __thiscall
PerseusBGPlanner::PerseusBGPlanner
          (PerseusBGPlanner *this,shared_ptr<const_PlanningUnitDecPOMDPDiscrete> *pu)

{
  PerseusQFunctionPlanner *in_RSI;
  undefined8 *in_RDI;
  shared_ptr<const_PlanningUnitDecPOMDPDiscrete> *in_stack_00000050;
  void **in_stack_00000058;
  AlphaVectorBG *in_stack_00000060;
  shared_ptr<const_PlanningUnitDecPOMDPDiscrete> *in_stack_000000b8;
  AlphaVectorPlanning *in_stack_000000c0;
  AlphaVectorPlanning *in_stack_000005c0;
  shared_ptr<const_PlanningUnitDecPOMDPDiscrete> *in_stack_ffffffffffffffe0;
  void **in_stack_ffffffffffffffe8;
  
  AlphaVectorPlanning::AlphaVectorPlanning(in_stack_000000c0,in_stack_000000b8);
  AlphaVectorBG::AlphaVectorBG(in_stack_00000060,in_stack_00000058,in_stack_00000050);
  PerseusQFunctionPlanner::PerseusQFunctionPlanner
            (in_RSI,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  *in_RDI = &PTR__PerseusBGPlanner_00d0f990;
  in_RDI[0x1d] = &PTR__PerseusBGPlanner_00d0fa58;
  in_RDI[3] = &PTR_GetImmediateRewardBeliefSet_00d0f9c8;
  *(undefined4 *)(in_RDI + 0x1c) = 2;
  AlphaVectorPlanning::Initialize(in_stack_000005c0);
  Perseus::Initialize((Perseus *)(in_RDI + 3));
  return;
}

Assistant:

PerseusBGPlanner::PerseusBGPlanner(const boost::shared_ptr<const PlanningUnitDecPOMDPDiscrete> &pu) :
    AlphaVectorPlanning(pu),
    AlphaVectorBG(pu),
    PerseusQFunctionPlanner(pu),
    _m_backupType(BGIP_SOLVER_EXHAUSTIVE)
{
    AlphaVectorPlanning::Initialize();
    Perseus::Initialize();
}